

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  u32 uVar2;
  uint uVar3;
  Wal *pWal;
  u32 *puVar4;
  _func_int_sqlite3_file_ptr *p_Var5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint *p;
  u32 uVar12;
  PgHdr **ppPVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  sqlite3_backup *p_00;
  uint uVar20;
  PgHdr *pPVar21;
  PgHdr *pPVar22;
  u32 uVar23;
  PgHdr *pPVar24;
  long in_FS_OFFSET;
  bool bVar25;
  WalWriter w;
  u32 salt1;
  PgHdr *local_a0;
  long local_98;
  sqlite3_file *local_90;
  uint *local_88;
  long local_80;
  WalWriter local_78;
  ulong local_58;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  uint local_4c;
  undefined8 local_48;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = pList;
  if (isCommit == 0) {
    iVar7 = 1;
  }
  else {
    iVar7 = 0;
    ppPVar13 = &local_a0;
    do {
      if (pList->pgno <= nTruncate) {
        ppPVar13 = &pList->pDirty;
      }
      iVar7 = iVar7 + (uint)(pList->pgno <= nTruncate);
      pList = pList->pDirty;
      *ppPVar13 = pList;
    } while (pList != (PgHdr *)0x0);
  }
  pPVar22 = local_a0;
  pPager->aStat[2] = pPager->aStat[2] + iVar7;
  if (local_a0->pgno == 1) {
    pager_write_changecounter(local_a0);
  }
  pWal = pPager->pWal;
  uVar2 = pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  uVar8 = (uint)bVar1;
  puVar4 = *pWal->apWiData;
  iVar7 = bcmp(&pWal->hdr,puVar4,0x30);
  if (iVar7 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = puVar4[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar4[0x18] == 0) {
LAB_001fcedd:
      if (pWal->exclusiveMode == '\0') {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
      }
      pWal->readLock = -1;
      iVar11 = 1;
      do {
        iVar7 = walTryBeginRead(pWal,(int *)&local_58,1,iVar11);
        iVar11 = iVar11 + 1;
      } while (iVar7 == -1);
    }
    else {
      sqlite3_randomness(4,&local_58);
      if (pWal->exclusiveMode != '\0') {
LAB_001fcbe2:
        walRestartHdr(pWal,(uint)local_58);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
        goto LAB_001fcedd;
      }
      iVar7 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      if (iVar7 == 5) goto LAB_001fcedd;
      if (iVar7 == 0) goto LAB_001fcbe2;
    }
    if (iVar7 != 0) goto LAB_001fd164;
  }
  uVar20 = (pWal->hdr).mxFrame;
  uVar16 = (ulong)uVar20;
  if (uVar16 == 0) {
    local_58 = 0x18e22d0082067f37;
    local_50 = (char)(uVar2 >> 0x18);
    local_4f = (char)(uVar2 >> 0x10);
    local_4e = (char)(uVar2 >> 8);
    local_4d = (char)uVar2;
    uVar10 = pWal->nCkpt;
    local_4c = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    if (uVar10 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_48 = *(undefined8 *)(pWal->hdr).aSalt;
    uVar23 = 0;
    uVar14 = 0xfffffffffffffff8;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + uVar23 + *(int *)(&local_50 + uVar14);
      uVar23 = uVar23 + *(int *)((long)&local_4c + uVar14) + uVar12;
      uVar14 = uVar14 + 8;
    } while (uVar14 < 0x10);
    local_40 = (undefined1)(uVar12 >> 0x18);
    local_3f = (undefined1)(uVar12 >> 0x10);
    local_3e = (undefined1)(uVar12 >> 8);
    local_3d = (undefined1)uVar12;
    local_3c = (undefined1)(uVar23 >> 0x18);
    local_3b = (undefined1)(uVar23 >> 0x10);
    local_3a = (undefined1)(uVar23 >> 8);
    local_39 = (undefined1)uVar23;
    pWal->szPage = uVar2;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar12;
    (pWal->hdr).aFrameCksum[1] = uVar23;
    pWal->truncateOnCommit = '\x01';
    iVar7 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_58,0x20,0);
    if ((iVar7 != 0) ||
       (((uVar8 != 0 && (pWal->syncHeader != '\0')) &&
        (iVar7 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar8 & 0x13), iVar7 != 0))))
    goto LAB_001fd164;
  }
  local_90 = pWal->pWalFd;
  local_78.iSyncPoint = 0;
  lVar17 = (long)(int)uVar2 + 0x18;
  lVar18 = uVar16 * lVar17 + 0x20;
  iVar11 = 0;
  local_78.pWal = pWal;
  local_78.pFd = local_90;
  local_78.syncFlags = uVar8;
  local_78.szPage = uVar2;
  if (pPVar22 == (PgHdr *)0x0) {
    pPVar21 = (PgHdr *)0x0;
  }
  else {
    pPVar21 = (PgHdr *)0x0;
    pPVar24 = pPVar22;
    do {
      if (uVar9 == 0) {
LAB_001fcb1c:
        if (isCommit == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = 0;
          if (pPVar24->pDirty == (PgHdr *)0x0) {
            uVar14 = (ulong)nTruncate;
          }
        }
LAB_001fcb36:
        iVar7 = walWriteOneFrame(&local_78,(PgHdr *)pPVar24->pData,pPVar24->pgno,uVar14);
        if (iVar7 != 0) goto LAB_001fd164;
        uVar16 = (ulong)((int)uVar16 + 1);
        lVar18 = lVar18 + lVar17;
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags | 0x40;
        pPVar21 = pPVar24;
      }
      else {
        if ((isCommit != 0) && (uVar14 = (ulong)nTruncate, pPVar24->pDirty == (PgHdr *)0x0))
        goto LAB_001fcb36;
        local_58 = local_58 & 0xffffffff00000000;
        sqlite3WalFindFrame(pWal,pPVar24->pgno,(u32 *)&local_58);
        if ((uint)local_58 < uVar9) goto LAB_001fcb1c;
        if ((uint)local_58 <= pWal->iReCksum - 1) {
          pWal->iReCksum = (uint)local_58;
        }
        iVar7 = (*pWal->pWalFd->pMethods->xWrite)
                          (pWal->pWalFd,pPVar24->pData,uVar2,
                           (ulong)((uint)local_58 - 1) * lVar17 + 0x38);
        if (iVar7 != 0) goto LAB_001fd164;
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags & 0xbf;
      }
      uVar20 = (uint)uVar16;
      pPVar24 = pPVar24->pDirty;
    } while (pPVar24 != (PgHdr *)0x0);
  }
  uVar9 = 0;
  if (isCommit != 0) {
    if (pWal->iReCksum != 0) {
      lVar19 = (long)(int)pWal->szPage + 0x18;
      iVar11 = (int)lVar19;
      p = (uint *)sqlite3_malloc(iVar11);
      if (p == (uint *)0x0) {
        iVar7 = 7;
        goto LAB_001fd164;
      }
      lVar15 = 0x18;
      if (pWal->iReCksum != 1) {
        lVar15 = (ulong)(pWal->iReCksum - 2) * lVar19 + 0x30;
      }
      local_98 = lVar18;
      iVar7 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar15);
      uVar9 = *p;
      (pWal->hdr).aFrameCksum[0] =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar9 = p[1];
      (pWal->hdr).aFrameCksum[1] =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar9 = pWal->iReCksum;
      pWal->iReCksum = 0;
      if (uVar9 <= uVar20 && iVar7 == 0) {
        local_80 = (long)iVar11;
        local_88 = p + 6;
        do {
          lVar18 = (ulong)(uVar9 - 1) * local_80 + 0x20;
          iVar7 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar11,lVar18);
          if (iVar7 != 0) {
            sqlite3_free(p);
            goto LAB_001fd164;
          }
          uVar10 = *p;
          uVar3 = p[1];
          walEncodeFrame(pWal,uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                              uVar10 << 0x18,
                         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18,(u8 *)local_88,(u8 *)&local_58);
          iVar7 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_58,0x18,lVar18);
        } while ((uVar9 + 1 <= uVar20) && (uVar9 = uVar9 + 1, iVar7 == 0));
      }
      sqlite3_free(p);
      lVar18 = local_98;
      if (iVar7 != 0) goto LAB_001fd164;
    }
    uVar9 = 0;
    iVar11 = 0;
    if ((bVar1 & 0x20) != 0) {
      if (pWal->padToSectorBoundary == '\0') {
        uVar9 = 0;
      }
      else {
        p_Var5 = pWal->pWalFd->pMethods->xSectorSize;
        if (p_Var5 == (_func_int_sqlite3_file_ptr *)0x0) {
          uVar16 = 0x1000;
        }
        else {
          uVar10 = (*p_Var5)(pWal->pWalFd);
          uVar9 = 0x10000;
          if (uVar10 < 0x10000) {
            uVar9 = uVar10;
          }
          uVar16 = 0x200;
          if (0x1f < (int)uVar10) {
            uVar16 = (ulong)uVar9;
          }
        }
        lVar15 = uVar16 + lVar18 + -1;
        lVar15 = lVar15 - lVar15 % (long)uVar16;
        iVar11 = 0;
        uVar9 = 0;
        local_78.iSyncPoint = lVar15;
        for (lVar19 = lVar18; lVar19 < lVar15; lVar19 = lVar19 + lVar17) {
          iVar7 = walWriteOneFrame(&local_78,(PgHdr *)pPVar21->pData,pPVar21->pgno,(ulong)nTruncate)
          ;
          if (iVar7 != 0) goto LAB_001fd164;
          uVar9 = uVar9 + 1;
        }
        if (lVar15 != lVar18) goto LAB_001fd04b;
      }
      iVar11 = (*local_90->pMethods->xSync)(local_90,uVar8 & 0x13);
    }
LAB_001fd04b:
    if ((pWal->truncateOnCommit != '\0') && (lVar18 = pWal->mxWalSize, -1 < lVar18)) {
      lVar17 = (ulong)(uVar20 + uVar9) * lVar17 + 0x20;
      if (lVar17 <= lVar18) {
        lVar17 = lVar18;
      }
      walLimitSize(pWal,lVar17);
      pWal->truncateOnCommit = '\0';
    }
  }
  uVar23 = (pWal->hdr).mxFrame;
  iVar7 = iVar11;
  pPVar24 = pPVar22;
  while ((pPVar24 != (PgHdr *)0x0 && (iVar7 == 0))) {
    iVar7 = 0;
    if ((pPVar24->flags & 0x40) != 0) {
      uVar23 = uVar23 + 1;
      iVar7 = walIndexAppend(pWal,uVar23,pPVar24->pgno);
    }
    pPVar24 = pPVar24->pDirty;
  }
  bVar25 = iVar7 == 0;
  if ((bVar25) && (0 < (int)uVar9)) {
    do {
      uVar23 = uVar23 + 1;
      iVar7 = walIndexAppend(pWal,uVar23,pPVar21->pgno);
      bVar25 = iVar7 == 0;
      if (!bVar25) break;
      bVar6 = 1 < uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar6);
  }
  if (bVar25) {
    (pWal->hdr).szPage = (ushort)(uVar2 >> 0x10) | (ushort)uVar2 & 0xff00;
    (pWal->hdr).mxFrame = uVar23;
    if (isCommit != 0) {
      puVar4 = &(pWal->hdr).iChange;
      *puVar4 = *puVar4 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar23;
    }
  }
  else if (iVar7 != 0) goto LAB_001fd164;
  p_00 = pPager->pBackup;
  iVar7 = 0;
  if (p_00 != (sqlite3_backup *)0x0 && pPVar22 != (PgHdr *)0x0) {
    while( true ) {
      if (p_00 != (sqlite3_backup *)0x0) {
        backupUpdate(p_00,pPVar22->pgno,(u8 *)pPVar22->pData);
      }
      pPVar22 = pPVar22->pDirty;
      if (pPVar22 == (PgHdr *)0x0) break;
      p_00 = pPager->pBackup;
    }
  }
LAB_001fd164:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}